

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

CPT * __thiscall despot::TabularCPT::CreateNoisyVariant(TabularCPT *this,double noise)

{
  NamedVar *child;
  TabularCPT *this_00;
  reference pvVar1;
  reference pvVar2;
  double extraout_XMM0_Qa;
  double dVar3;
  double dVar4;
  uint local_5c;
  uint local_58;
  int c;
  int p;
  int i;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> local_40;
  TabularCPT *local_28;
  TabularCPT *cpt;
  int child_size;
  int parent_size;
  double noise_local;
  TabularCPT *this_local;
  
  _child_size = noise;
  noise_local = (double)this;
  cpt._4_4_ = (*(this->super_CPT).super_Function._vptr_Function[7])();
  cpt._0_4_ = (*(this->super_CPT).super_Function._vptr_Function[9])();
  this_00 = (TabularCPT *)operator_new(0x70);
  child = (this->super_CPT).super_Function.child_;
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector
            (&local_40,&(this->super_CPT).super_Function.parents_);
  TabularCPT(this_00,child,&local_40);
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::~vector(&local_40);
  local_28 = this_00;
  std::
  vector<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
  ::clear(&(this_00->super_CPT).super_Function.map_);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&(local_28->super_CPT).super_Function.values_,(long)cpt._4_4_);
  for (c = 0; c < cpt._4_4_; c = c + 1) {
    pvVar1 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&(local_28->super_CPT).super_Function.values_,(long)c);
    std::vector<double,_std::allocator<double>_>::resize(pvVar1,(long)(int)cpt);
  }
  for (local_58 = 0; (int)local_58 < cpt._4_4_; local_58 = local_58 + 1) {
    for (local_5c = 0; (int)local_5c < (int)cpt; local_5c = local_5c + 1) {
      (*(this->super_CPT).super_Function._vptr_Function[4])(this,(ulong)local_58,(ulong)local_5c);
      dVar3 = _child_size / (double)(int)cpt;
      dVar4 = _child_size + 1.0;
      pvVar1 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&(local_28->super_CPT).super_Function.values_,(long)(int)local_58);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,(long)(int)local_5c);
      *pvVar2 = (extraout_XMM0_Qa + dVar3) / dVar4;
    }
  }
  return &local_28->super_CPT;
}

Assistant:

CPT* TabularCPT::CreateNoisyVariant(double noise) const {
	int parent_size = ParentSize(), child_size = ChildSize();

	TabularCPT* cpt = new TabularCPT(child_, parents_);
	cpt->map_.clear();

	cpt->values_.resize(parent_size);
	for (int i = 0; i < parent_size; i++)
		cpt->values_[i].resize(child_size);

	for (int p = 0; p < parent_size; p++) {
		for (int c = 0; c < child_size; c++) {
			cpt->values_[p][c] = (GetValue(p, c) + noise / child_size)
				/ (1 + noise);
		}
	}

	return cpt;
}